

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O3

void __thiscall Bob::ObliviousExecute(Bob *this)

{
  long *plVar1;
  pointer pvVar2;
  Bob *pBVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  Message MVar10;
  Message local_88;
  Message local_78;
  long *local_68 [2];
  long local_58 [2];
  double local_48;
  double local_40;
  Bob *local_38;
  
  if (ObliviousExecute()::fout == '\0') {
    iVar4 = __cxa_guard_acquire(&ObliviousExecute()::fout);
    if (iVar4 != 0) {
      std::ofstream::ofstream(ObliviousExecute()::fout,"../debug/bob/Debug_B.txt",_S_out);
      __cxa_atexit(std::ofstream::~ofstream,ObliviousExecute()::fout,&__dso_handle);
      __cxa_guard_release(&ObliviousExecute()::fout);
    }
  }
  local_38 = this;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ObliviousExecute()::fout,"Bob: Oblivious Execute Run # ",0x1d);
  iVar4 = ObliviousExecute::count;
  ObliviousExecute::count = ObliviousExecute::count + 1;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)ObliviousExecute()::fout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ObliviousExecute()::fout,"Bob: pc = ",10);
  poVar5 = std::ostream::_M_insert<long>(0x10b220);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  plVar1 = (this->super_Party).P.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(this->super_Party).pc].
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_78.scalar1 = *plVar1;
  local_78.scalar2 = plVar1[1];
  MVar10 = Client::Receive(local_38->cli);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ObliviousExecute()::fout,"Bob: Msg rcvd from Alice : ",0x1b);
  poVar5 = std::ostream::_M_insert<long>(0x10b220);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  Client::Send(local_38->cli,&local_78);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ObliviousExecute()::fout,"Bob: Msg sent to Alice : ",0x19);
  poVar5 = std::ostream::_M_insert<long>(0x10b220);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  pBVar3 = local_38;
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  plVar1 = (pBVar3->super_Party).P.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(pBVar3->super_Party).pc].
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  uVar9 = MVar10.scalar1 + *plVar1;
  uVar7 = MVar10.scalar2 + plVar1[1];
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ObliviousExecute()::fout,"Bob: a = ",9);
  iVar8 = (int)uVar9;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)ObliviousExecute()::fout,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," b = ",5);
  iVar4 = (int)uVar7;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if (((iVar8 < 0) || (iVar4 < 0)) || (iVar8 == 0 && iVar4 == 0)) {
    (pBVar3->super_Party).termination_condition = true;
  }
  else {
    uVar9 = uVar9 & 0x7fffffff;
    pvVar2 = (pBVar3->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar1 = pvVar2[uVar9].super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = *plVar1 - *pvVar2[uVar7 & 0x7fffffff].super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    *plVar1 = lVar6;
    (pBVar3->super_Party).output = lVar6;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,">=","");
    local_88.scalar2 =
         *(pBVar3->super_Party).D.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar9].
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    local_88.scalar1 = 0;
    Client::Send(pBVar3->cli,&local_88);
    MVar10 = Client::Receive(pBVar3->cli);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ObliviousExecute()::fout,"Bob: OC output  beta\" = ",0x18);
    poVar5 = std::ostream::_M_insert<long>(0x10b220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    pBVar3 = local_38;
    local_48 = ObliviousMultiplication
                         (local_38,MVar10.scalar1,
                          *(long *)(*(long *)&(local_38->super_Party).P.
                                              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(local_38->super_Party).pc].
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ObliviousExecute()::fout,"Bob: OM output beta\"* P\"[pc][2] : ",0x22);
    poVar5 = std::ostream::_M_insert<double>(local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    local_40 = ObliviousMultiplication
                         (pBVar3,-MVar10.scalar1,
                          *(long *)(*(long *)&(pBVar3->super_Party).P.
                                              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(pBVar3->super_Party).pc].
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data + 0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ObliviousExecute()::fout,"Bob: OM output (-beta\")(P\"[pc][3]) : ",0x25);
    poVar5 = std::ostream::_M_insert<double>(local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    (pBVar3->super_Party).pc = (long)(local_48 + local_40);
  }
  return;
}

Assistant:

void Bob::ObliviousExecute()
{
    static std::ofstream fout("../debug/bob/Debug_B.txt");
    static int count = 0;
    fout<<"Bob: Oblivious Execute Run # "<<count++<<"\n";
    fout<<"Bob: pc = "<<pc<<"\n";
    /*------- Step 1 -------*/
    Message msg_for_Alice, msg_from_Alice;
    msg_for_Alice.scalar1 = P[pc][0];
    msg_for_Alice.scalar2 = P[pc][1];
    msg_from_Alice = cli->Receive();
    fout<<"Bob: Msg rcvd from Alice : "<<msg_from_Alice.scalar1 << " "<<msg_from_Alice.scalar2<<"\n";
    cli->Send(msg_for_Alice);
    fout<<"Bob: Msg sent to Alice : "<<msg_for_Alice.scalar1 << " "<<msg_for_Alice.scalar2<<"\n";
    /*------- Step 2 -------*/
    int a = P[pc][0] + msg_from_Alice.scalar1;
    int b = P[pc][1] + msg_from_Alice.scalar2;
    fout<<"Bob: a = "<<a<<" b = "<<b<<"\n";
    if(a<0 || b<0 ||(a==0 && b==0)){
        termination_condition =  true;
        return;
    }        
    /*------- Step 3 -------*/
    D[a][0] = D[a][0] - D[b][0];
    output = D[a][0];
    /*------- Step 4 -------*/
    long beta = ObliviousComparison(">=", 0, D[a][0]);
    fout<<"Bob: OC output  beta\" = "<<beta<<"\n";
    /*------- Step 5 -------*/
    double next_pc = ObliviousMultiplication(beta, P[pc][2]);
    fout<< "Bob: OM output beta\"* P\"[pc][2] : "<<next_pc<<"\n";
    double temp = ObliviousMultiplication(-beta, P[pc][3]);
    fout<< "Bob: OM output (-beta\")(P\"[pc][3]) : "<<temp<<"\n";
    pc = next_pc + temp;    
}